

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::buildBinary(TranslateToFuzzReader *this,BinaryArgs *args)

{
  BinaryOp BVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  
  BVar1 = args->a;
  pEVar2 = args->b;
  pEVar3 = args->c;
  pEVar4 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
  pEVar4->_id = BinaryId;
  (pEVar4->type).id = 0;
  *(BinaryOp *)(pEVar4 + 1) = BVar1;
  pEVar4[1].type.id = (uintptr_t)pEVar2;
  *(Expression **)(pEVar4 + 2) = pEVar3;
  wasm::Binary::finalize();
  return pEVar4;
}

Assistant:

Expression* TranslateToFuzzReader::buildBinary(const BinaryArgs& args) {
  return builder.makeBinary(args.a, args.b, args.c);
}